

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O0

void __thiscall
m2d::savanna::ssl_reuse::
https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::on_read_l(https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
            *this,error_code ec,size_t bytes_transferred)

{
  delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *pdVar1;
  undefined1 uVar2;
  int iVar3;
  ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>
  *this_00;
  undefined7 uVar4;
  bool local_241;
  enable_shared_from_this<m2d::savanna::ssl_reuse::interface> local_240;
  code *local_230;
  undefined8 local_228;
  bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
  local_220;
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_1f0;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_148;
  https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *local_50;
  undefined1 local_48 [31];
  byte local_29;
  size_t sStack_28;
  bool unfollow;
  size_t bytes_transferred_local;
  https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *this_local;
  error_code ec_local;
  
  uVar4 = (undefined7)(bytes_transferred >> 8);
  ec_local._0_8_ = ec.cat_;
  this_local = ec._0_8_;
  local_29 = 1;
  sStack_28 = bytes_transferred;
  bytes_transferred_local = (size_t)this;
  uVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  local_241 = false;
  if ((bool)uVar2) {
    boost::system::error_condition::error_condition<boost::system::errc::errc_t>
              ((error_condition *)(local_48 + 8),not_connected,(type *)0x0);
    local_241 = boost::system::operator!=
                          ((error_code *)&this_local,(error_condition *)(local_48 + 8));
  }
  if (local_241 == false) {
    if (this->delegate_ !=
        (delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
         *)0x0) {
      pdVar1 = this->delegate_;
      boost::beast::http::
      message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::message(&local_1f0,&this->response_);
      result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
      ::result(&local_148,&local_1f0);
      iVar3 = (**pdVar1->_vptr_delegate)(pdVar1,&local_148);
      local_29 = (byte)iVar3 & 1;
      result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
      ::~result(&local_148);
      boost::beast::http::
      message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::~message(&local_1f0);
    }
  }
  else {
    local_50 = this_local;
    local_48._0_4_ = ec_local.val_;
    local_48[4] = ec_local.failed_;
    local_48._5_3_ = ec_local._5_3_;
    (*(this->super_interface)._vptr_interface[8])(this,this_local,ec_local._0_8_);
  }
  if ((local_29 & 1) != 0) {
    this_00 = (ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>
               *)std::
                 __shared_ptr_access<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->ssl_stream_);
    local_230 = ssl_reuse::interface::on_shutdown;
    local_228 = 0;
    std::enable_shared_from_this<m2d::savanna::ssl_reuse::interface>::shared_from_this(&local_240);
    boost::beast::
    bind_front_handler<void(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code),std::shared_ptr<m2d::savanna::ssl_reuse::interface>>
              (&local_220,(beast *)&local_230,(offset_in_interface_to_subr *)&local_240,
               (shared_ptr<m2d::savanna::ssl_reuse::interface> *)CONCAT71(uVar4,uVar2));
    boost::beast::
    ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>
    ::
    async_shutdown<boost::beast::detail::bind_front_wrapper<void(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code),std::shared_ptr<m2d::savanna::ssl_reuse::interface>>>
              (this_00,&local_220);
    boost::beast::detail::
    bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
    ::~bind_front_wrapper(&local_220);
    std::shared_ptr<m2d::savanna::ssl_reuse::interface>::~shared_ptr
              ((shared_ptr<m2d::savanna::ssl_reuse::interface> *)&local_240);
  }
  return;
}

Assistant:

void on_read_l(beast::error_code ec, std::size_t bytes_transferred) override {
			bool unfollow = true;
			if (ec && ec != beast::errc::not_connected) {
				error_callback(ec);
			}
			else {
				if(delegate_) unfollow = delegate_->completion_callback(savanna::result<http::response<Body>>(std::move(response_)));
			}
			if(unfollow){
				ssl_stream_->async_shutdown(beast::bind_front_handler(&https_logic<Body>::on_shutdown,this->shared_from_this()));
			}
		}